

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_contextual_end(nk_context *ctx)

{
  undefined4 uVar1;
  undefined4 uVar2;
  nk_window *pnVar3;
  nk_panel *pnVar4;
  nk_rect rect;
  int iVar5;
  int iVar6;
  nk_vec2 nVar7;
  int in_body;
  int pressed;
  nk_vec2 padding;
  nk_rect body;
  nk_panel *panel;
  nk_window *popup;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x435d,"void nk_contextual_end(struct nk_context *)");
  }
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x435e,"void nk_contextual_end(struct nk_context *)");
  }
  if ((ctx != (nk_context *)0x0) && (ctx->current != (nk_window *)0x0)) {
    pnVar3 = ctx->current;
    pnVar4 = pnVar3->layout;
    if (pnVar3->parent == (nk_window *)0x0) {
      __assert_fail("popup->parent",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                    ,0x4363,"void nk_contextual_end(struct nk_context *)");
    }
    if ((pnVar4->type &
        (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL|NK_PANEL_POPUP)) ==
        NK_PANEL_NONE) {
      __assert_fail("panel->type & NK_PANEL_SET_POPUP",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                    ,0x4364,"void nk_contextual_end(struct nk_context *)");
    }
    if ((pnVar4->flags & 0x800) != 0) {
      memset(&padding,0,0x10);
      if (pnVar4->at_y < (pnVar4->bounds).y + (pnVar4->bounds).h) {
        nVar7 = nk_panel_get_padding(&ctx->style,pnVar4->type);
        uVar1 = (pnVar4->bounds).x;
        uVar2 = (pnVar4->bounds).w;
        pressed = (int)nVar7.y;
        padding.y = pnVar4->at_y + pnVar4->footer_height + pnVar4->border + (float)pressed +
                    (pnVar4->row).height;
        body.y = ((pnVar4->bounds).y + (pnVar4->bounds).h) - padding.y;
        padding.x = (float)uVar1;
        body.x = (float)uVar2;
      }
      iVar5 = nk_input_is_mouse_pressed(&ctx->input,NK_BUTTON_LEFT);
      rect.y = padding.y;
      rect.x = padding.x;
      rect.w = body.x;
      rect.h = body.y;
      iVar6 = nk_input_is_mouse_hovering_rect(&ctx->input,rect);
      if ((iVar5 != 0) && (iVar6 != 0)) {
        pnVar3->flags = pnVar3->flags | 0x2000;
      }
    }
    if ((pnVar3->flags & 0x2000) != 0) {
      pnVar3->seq = 0;
    }
    nk_popup_end(ctx);
  }
  return;
}

Assistant:

NK_API void
nk_contextual_end(struct nk_context *ctx)
{
    struct nk_window *popup;
    struct nk_panel *panel;
    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    if (!ctx || !ctx->current) return;

    popup = ctx->current;
    panel = popup->layout;
    NK_ASSERT(popup->parent);
    NK_ASSERT(panel->type & NK_PANEL_SET_POPUP);
    if (panel->flags & NK_WINDOW_DYNAMIC) {
        /* Close behavior
        This is a bit of a hack solution since we do not know before we end our popup
        how big it will be. We therefore do not directly know when a
        click outside the non-blocking popup must close it at that direct frame.
        Instead it will be closed in the next frame.*/
        struct nk_rect body = {0,0,0,0};
        if (panel->at_y < (panel->bounds.y + panel->bounds.h)) {
            struct nk_vec2 padding = nk_panel_get_padding(&ctx->style, panel->type);
            body = panel->bounds;
            body.y = (panel->at_y + panel->footer_height + panel->border + padding.y + panel->row.height);
            body.h = (panel->bounds.y + panel->bounds.h) - body.y;
        }
        {int pressed = nk_input_is_mouse_pressed(&ctx->input, NK_BUTTON_LEFT);
        int in_body = nk_input_is_mouse_hovering_rect(&ctx->input, body);
        if (pressed && in_body)
            popup->flags |= NK_WINDOW_HIDDEN;
        }
    }
    if (popup->flags & NK_WINDOW_HIDDEN)
        popup->seq = 0;
    nk_popup_end(ctx);
    return;
}